

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkList.c
# Opt level: O2

void ListDinsert(DuNode_conflict L,int i,int e)

{
  DuNode *pDVar1;
  int j;
  int iVar2;
  DuNode *pDVar3;
  
  iVar2 = 0;
  for (; (iVar2 < i && (L != (DuNode_conflict)0x0)); L = L->Next) {
    iVar2 = iVar2 + 1;
  }
  pDVar3 = (DuNode *)malloc(0x18);
  pDVar3->Element = e;
  pDVar1 = L->prior;
  pDVar3->prior = pDVar1;
  pDVar1->Next = pDVar3;
  pDVar3->Next = L;
  L->prior = pDVar3;
  return;
}

Assistant:

void ListDinsert(DuNode L, int i,int e){
    int j = 0;
    DuNode p = L;   //定义结点p指向头节点
    while(j < i && p != NULL){        //找到插入节点的后继
        p = p->Next;
        j++;
    }
    DuNode s = (DuNode)malloc(sizeof(DNode));       //分配一块内存给新节点
    s->Element = e;     //赋值给新节点
    s->prior = p->prior;    //新节点的prior指向第i位置的prior
    p->prior->Next = s; //第i位置prior的next指针指向新节点
    s->Next = p;    //新节点next指向第i节点
    p->prior = s;   //第i节prior指向新节点
}